

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

Am_Wrapper * compute_list_path_proc(Am_Object *self)

{
  anon_union_8_8_ea4c8939_for_value aVar1;
  bool bVar2;
  unsigned_short uVar3;
  Am_Value *pAVar4;
  int local_78;
  int local_74;
  int i;
  int value2_pos;
  int value1_pos;
  Am_Value_List new_list;
  Am_Value_List list;
  Am_Value value2;
  undefined1 local_28 [8];
  Am_Value value1;
  Am_Object *self_local;
  
  value1.value = (anon_union_8_8_ea4c8939_for_value)self;
  Am_Value::Am_Value((Am_Value *)local_28);
  pAVar4 = Am_Object::Peek((Am_Object *)value1.value.wrapper_value,0x181,0);
  Am_Value::operator=((Am_Value *)local_28,pAVar4);
  Am_Value::Am_Value((Am_Value *)&list.item);
  pAVar4 = Am_Object::Peek((Am_Object *)value1.value.wrapper_value,0x182,0);
  Am_Value::operator=((Am_Value *)&list.item,pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)value1.value.wrapper_value,0x114,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&new_list.item,pAVar4);
  Am_Value_List::Am_Value_List((Am_Value_List *)&value1_pos);
  bVar2 = Am_Value_List::Valid((Am_Value_List *)&new_list.item);
  if (bVar2) {
    i = list_position((Am_Value_List *)&new_list.item,(Am_Value *)local_28);
    if (i == -1) {
      i = 0;
    }
    local_74 = list_position((Am_Value_List *)&new_list.item,(Am_Value *)&list.item);
    if (local_74 == -1) {
      uVar3 = Am_Value_List::Length((Am_Value_List *)&new_list.item);
      local_74 = uVar3 - 1;
    }
    Am_Value_List::Start((Am_Value_List *)&new_list.item);
    Am_Value_List::Move_Nth((Am_Value_List *)&new_list.item,i);
    aVar1 = value1.value;
    pAVar4 = Am_Value_List::Get((Am_Value_List *)&new_list.item);
    Am_Object::Set((Am_Object *)aVar1.wrapper_value,0x181,pAVar4,0);
    for (local_78 = i; local_78 < local_74; local_78 = local_78 + 1) {
      pAVar4 = Am_Value_List::Get((Am_Value_List *)&new_list.item);
      Am_Value_List::Add((Am_Value_List *)&value1_pos,pAVar4,Am_TAIL,true);
      Am_Value_List::Next((Am_Value_List *)&new_list.item);
    }
    for (; local_74 < local_78; local_78 = local_78 + -1) {
      pAVar4 = Am_Value_List::Get((Am_Value_List *)&new_list.item);
      Am_Value_List::Add((Am_Value_List *)&value1_pos,pAVar4,Am_TAIL,true);
      Am_Value_List::Prev((Am_Value_List *)&new_list.item);
    }
    pAVar4 = Am_Value_List::Get((Am_Value_List *)&new_list.item);
    Am_Value_List::Add((Am_Value_List *)&value1_pos,pAVar4,Am_TAIL,true);
    aVar1 = value1.value;
    pAVar4 = Am_Value_List::Get((Am_Value_List *)&new_list.item);
    Am_Object::Set((Am_Object *)aVar1.wrapper_value,0x182,pAVar4,0);
    self_local = (Am_Object *)
                 Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&value1_pos);
  }
  else {
    self_local = (Am_Object *)
                 Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&new_list.item);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)&value1_pos);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&new_list.item);
  Am_Value::~Am_Value((Am_Value *)&list.item);
  Am_Value::~Am_Value((Am_Value *)local_28);
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Value_List_Formula(compute_list_path)
{
  Am_Value value1;
  value1 = self.Peek(Am_VALUE_1);
  Am_Value value2;
  value2 = self.Peek(Am_VALUE_2);
  Am_Value_List list = self.Get(Am_LIST_OF_VALUES);
  Am_Value_List new_list;

  if (!list.Valid())
    return list;

  // find value1 and value2 in the list.
  // if value1 isn't present, assume first element;
  // if value2 isn't present, assume last.
  int value1_pos = list_position(list, value1);
  if (value1_pos == -1)
    value1_pos = 0;

  int value2_pos = list_position(list, value2);
  if (value2_pos == -1)
    value2_pos = ((int)list.Length()) - 1;

  // starting at value1...
  list.Start();
  list.Move_Nth(value1_pos);
  self.Set(Am_VALUE_1, list.Get());
  int i = value1_pos;

  // either add following elements (if value1 precedes value2)
  while (i < value2_pos) {
    new_list.Add(list.Get());
    list.Next();
    ++i;
  }

  // OR, add preceding elements (if value1 follows value2)
  while (i > value2_pos) {
    new_list.Add(list.Get());
    list.Prev();
    --i;
  }

  // then add value2 itself
  new_list.Add(list.Get());
  self.Set(Am_VALUE_2, list.Get());

  return new_list;
}